

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Int_t * Pdr_InvMap(Vec_Int_t *vCounts)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  ulong uVar5;
  int iVar6;
  
  uVar1 = vCounts->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_005f76da;
    }
  }
  __s = (int *)0x0;
LAB_005f76da:
  if (0 < (int)uVar1) {
    piVar2 = vCounts->pArray;
    uVar5 = 0;
    iVar6 = 0;
    do {
      if (piVar2[uVar5] != 0) {
        if (uVar1 <= uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar5] = iVar6;
        iVar6 = iVar6 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar1);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Pdr_InvMap( Vec_Int_t * vCounts )
{
    int i, k = 0, Count;
    Vec_Int_t * vMap = Vec_IntStart( Vec_IntSize(vCounts) );
    Vec_IntForEachEntry( vCounts, Count, i )
        if ( Count )
            Vec_IntWriteEntry( vMap, i, k++ );
    return vMap;
}